

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::RenderPixelEllipsis(ImDrawList *draw_list,ImVec2 pos,int count,ImU32 col)

{
  ImFont *pIVar1;
  int iVar2;
  float fVar3;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar4;
  ImVec2 local_68;
  ImVec2 local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  fVar3 = pos.x;
  if (0 < count) {
    pIVar1 = draw_list->_Data->Font;
    local_60.y = (float)(int)((draw_list->_Data->FontSize / pIVar1->FontSize) * pIVar1->Ascent +
                              (pIVar1->DisplayOffset).y + 0.5 + -1.0) + pos.y;
    fVar4 = local_60.y + 1.0;
    iVar2 = 0;
    local_48._8_4_ = in_XMM0_Dc;
    local_48._0_8_ = pos;
    local_48._12_4_ = in_XMM0_Dd;
    local_58 = ZEXT416((uint)local_60.y);
    do {
      local_60.x = (float)iVar2 + (float)iVar2 + fVar3;
      local_68.x = local_60.x + 1.0;
      if (0xffffff < col) {
        local_68.y = fVar4;
        ImDrawList::PrimReserve(draw_list,6,4);
        ImDrawList::PrimRect(draw_list,&local_60,&local_68,col);
        fVar3 = (float)local_48._0_4_;
        local_60.y = (float)local_58._0_4_;
      }
      iVar2 = iVar2 + 1;
    } while (count != iVar2);
  }
  return;
}

Assistant:

void ImGui::RenderPixelEllipsis(ImDrawList* draw_list, ImVec2 pos, int count, ImU32 col)
{
    ImFont* font = draw_list->_Data->Font;
    const float font_scale = draw_list->_Data->FontSize / font->FontSize;
    pos.y += (float)(int)(font->DisplayOffset.y + font->Ascent * font_scale + 0.5f - 1.0f);
    for (int dot_n = 0; dot_n < count; dot_n++)
        draw_list->AddRectFilled(ImVec2(pos.x + dot_n * 2.0f, pos.y), ImVec2(pos.x + dot_n * 2.0f + 1.0f, pos.y + 1.0f), col);
}